

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall WriteUint128_BufferTooSmall_Test::TestBody(WriteUint128_BufferTooSmall_Test *this)

{
  undefined1 auVar1 [16];
  internal iVar2;
  int line;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs;
  char *pcVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *message;
  v128 bits;
  string actual;
  char buffer_1 [3];
  size_type __dnew;
  char buffer [20];
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  undefined7 uStack_40;
  undefined4 uStack_39;
  char local_35 [13];
  AssertHelper local_28;
  
  bits.v._8_8_ = in_R8;
  bits.v[0] = 0xff;
  bits.v[1] = 0xff;
  bits.v[2] = 0xff;
  bits.v[3] = 0xff;
  bits.v[4] = 0xff;
  bits.v[5] = 0xff;
  bits.v[6] = 0xff;
  bits.v[7] = 0xff;
  wabt::WriteUint128((wabt *)&local_48,(char *)0x14,0xffffffffffffffff,bits);
  local_58._M_head_impl = local_58._M_head_impl & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)local_80,"buffer[19]","\'\\0\'",local_35,(char *)&local_58);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    this_00 = &local_60;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
               ,0x33a,pcVar3);
    message = &local_58;
  }
  else {
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13;
    rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    local_80 = (undefined1  [8])&local_70;
    local_80 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)rhs,(ulong)&local_58);
    local_70._M_allocated_capacity = (size_type)local_58._M_head_impl;
    *(undefined4 *)((long)local_80 + 0xf) = uStack_39;
    *(size_type *)local_80 = CONCAT71(local_48._M_head_impl._1_7_,local_48._M_head_impl._0_1_);
    *(ulong *)((long)local_80 + 8) = CONCAT17((undefined1)uStack_39,uStack_40);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_58._M_head_impl;
    *(char *)((long)local_80 + (long)local_58._M_head_impl) = '\0';
    testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
              ((internal *)&local_58,"\"3402823669209384634\"","actual",
               (char (*) [20])"3402823669209384634",rhs);
    iVar2 = local_58._M_head_impl._0_1_;
    if (local_58._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ee0e1;
      }
      else {
        rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
                 ,0x33c,(char *)rhs);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (local_80 != (undefined1  [8])&local_70) {
      operator_delete((void *)local_80,(ulong)(local_70._M_allocated_capacity + 1));
    }
    if (iVar2 == (internal)0x0) {
      return;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rhs;
    wabt::WriteUint128((wabt *)&local_60,(char *)0x3,0x7b,(v128)(auVar1 << 0x40));
    local_48._M_head_impl._0_1_ = (wabt)0x31;
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)local_80,"buffer[0]","\'1\'",(char *)&local_60,(char *)&local_48);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_78->_M_dataplus)._M_p;
      }
      line = 0x342;
    }
    else {
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      local_48._M_head_impl._0_1_ = (wabt)0x32;
      testing::internal::CmpHelperEQ<char,char>
                ((internal *)local_80,"buffer[1]","\'2\'",(char *)((long)&local_60._M_head_impl + 1)
                 ,(char *)&local_48);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_78->_M_dataplus)._M_p;
        }
        line = 0x343;
      }
      else {
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_48._M_head_impl._0_1_ = (wabt)0x0;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)local_80,"buffer[2]","\'\\0\'",
                   (char *)((long)&local_60._M_head_impl + 2),(char *)&local_48);
        if (local_80[0] != (internal)0x0) goto LAB_00153f0b;
        testing::Message::Message((Message *)&local_48);
        if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_78->_M_dataplus)._M_p;
        }
        line = 0x344;
      }
    }
    this_00 = &local_58;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
               ,line,pcVar3);
    message = &local_48;
  }
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (message->_M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)message->_M_head_impl + 8))();
  }
LAB_00153f0b:
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  return;
}

Assistant:

TEST(WriteUint128, BufferTooSmall) {
  {
    char buffer[20];
    WriteUint128(buffer, 20, {0xffffffff, 0xffffffff, 0xffffffff, 0xffffffff});
    ASSERT_EQ(buffer[19], '\0');
    std::string actual(buffer, buffer + 19);
    ASSERT_EQ("3402823669209384634", actual);
  }

  {
    char buffer[3];
    WriteUint128(buffer, 3, {123, 0, 0, 0});
    ASSERT_EQ(buffer[0], '1');
    ASSERT_EQ(buffer[1], '2');
    ASSERT_EQ(buffer[2], '\0');
  }
}